

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

MPLSStreamInfo * __thiscall
MPLSParser::getStreamByPID(MPLSStreamInfo *__return_storage_ptr__,MPLSParser *this,int pid)

{
  bool bVar1;
  reference other;
  MPLSStreamInfo *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> *__range1;
  int pid_local;
  MPLSParser *this_local;
  
  __end1 = std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::begin(&this->m_streamInfo);
  i = (MPLSStreamInfo *)
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::end(&this->m_streamInfo);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
                                *)&i);
    if (!bVar1) {
      MPLSStreamInfo::MPLSStreamInfo(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    other = __gnu_cxx::
            __normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
            ::operator*(&__end1);
    if ((other->super_M2TSStreamInfo).streamPID == pid) break;
    __gnu_cxx::
    __normal_iterator<const_MPLSStreamInfo_*,_std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>_>
    ::operator++(&__end1);
  }
  MPLSStreamInfo::MPLSStreamInfo(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

MPLSStreamInfo MPLSParser::getStreamByPID(const int pid) const
{
    for (auto& i : m_streamInfo)
    {
        if (i.streamPID == pid)
            return i;
    }
    return {};
}